

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

string * testing::PrintToString<unsigned_long_long>
                   (string *__return_storage_ptr__,unsigned_long_long *value)

{
  ostream *local_1b8;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream aoStack_190 [376];
  unsigned_long_long *local_18;
  unsigned_long_long *value_local;
  
  local_18 = value;
  value_local = (unsigned_long_long *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1b8 = (ostream *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x1a0) {
    local_1b8 = aoStack_190;
  }
  internal::UniversalTersePrinter<unsigned_long_long>::Print(local_18,local_1b8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

::std::string PrintToString(const T& value) {
  ::std::stringstream ss;
  internal::UniversalTersePrinter<T>::Print(value, &ss);
  return ss.str();
}